

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys.cpp
# Opt level: O1

string * __thiscall
jbcoin::ValidatorToken::toString_abi_cxx11_(string *__return_storage_ptr__,ValidatorToken *this)

{
  Value *pVVar1;
  int in_ECX;
  Value *value;
  Value jv;
  ValueHolder local_58;
  size_t local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  Value local_38;
  Value local_28;
  
  Json::Value::Value(&local_38,nullValue);
  strHex<unsigned_char_const*>((string *)&local_58,(jbcoin *)&this->secretKey,&DAT_00000020,in_ECX);
  Json::Value::Value(&local_28,(string *)&local_58);
  pVVar1 = Json::Value::operator[](&local_38,"validation_secret_key");
  Json::Value::operator=(pVVar1,&local_28);
  Json::Value::~Value(&local_28);
  if (local_58 != &local_48) {
    operator_delete(local_58.string_,local_48._M_allocated_capacity + 1);
  }
  Json::Value::Value((Value *)&local_58,&this->manifest);
  pVVar1 = Json::Value::operator[](&local_38,"manifest");
  Json::Value::operator=(pVVar1,(Value *)&local_58);
  Json::Value::~Value((Value *)&local_58);
  Json::to_string_abi_cxx11_((string *)&local_58,(Json *)&local_38,value);
  beast::detail::base64_encode<void>(__return_storage_ptr__,(uint8_t *)local_58.string_,local_50);
  if (local_58 != &local_48) {
    operator_delete(local_58.string_,local_48._M_allocated_capacity + 1);
  }
  Json::Value::~Value(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string
ValidatorToken::toString () const
{
    Json::Value jv;
    jv["validation_secret_key"] = strHex(secretKey.data(), secretKey.size());
    jv["manifest"] = manifest;

    return beast::detail::base64_encode(to_string(jv));
}